

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::clipPrimitives
               (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *list,Program *program,
               bool clipWithZPlanes,VertexPacketAllocator *vpalloc)

{
  float fVar1;
  long lVar2;
  Line *pLVar3;
  float *pfVar4;
  size_type sVar5;
  const_reference pvVar6;
  pointer local_1a0;
  Line local_198;
  Vector<float,_4> local_180;
  Vector<float,_4> local_170;
  undefined1 local_160 [8];
  Vec4 a1;
  Vec4 a0;
  size_t outputNdx;
  undefined8 local_118;
  undefined8 local_110;
  Vector<double,_4> local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Line local_d8;
  ClipFloat local_c0;
  ClipFloat t1;
  ClipFloat t0;
  ClipVec4 p1;
  undefined1 local_80 [8];
  ClipVec4 p0;
  Line *l;
  size_t ndx;
  undefined1 local_48 [8];
  vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> visibleLines;
  vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_> *fragInputs;
  VertexPacketAllocator *vpalloc_local;
  bool clipWithZPlanes_local;
  Program *program_local;
  vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *list_local;
  
  if (program->geometryShader == (GeometryShader *)0x0) {
    local_1a0 = (pointer)VertexShader::getOutputs(program->vertexShader);
  }
  else {
    local_1a0 = (pointer)GeometryShader::getOutputs(program->geometryShader);
  }
  visibleLines.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_1a0;
  std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::vector
            ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)local_48);
  if (clipWithZPlanes) {
    for (l = (Line *)0x0;
        pLVar3 = (Line *)std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::size(list),
        l < pLVar3; l = (Line *)((long)&l->v0 + 1)) {
      p0.m_data[3] = (double)std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::operator[]
                                       (list,(size_type)l);
      pfVar4 = tcu::Vector<float,_4>::z(&((reference)p0.m_data[3])->v0->position);
      fVar1 = *pfVar4;
      pfVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(*(long *)p0.m_data[3] + 8));
      if (-*pfVar4 <= fVar1) {
LAB_00285dde:
        pfVar4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(*(long *)p0.m_data[3] + 8));
        fVar1 = *pfVar4;
        pfVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(*(long *)p0.m_data[3] + 8));
        if (*pfVar4 <= fVar1 && fVar1 != *pfVar4) {
          pfVar4 = tcu::Vector<float,_4>::z
                             ((Vector<float,_4> *)(*(long *)((long)p0.m_data[3] + 8) + 8));
          fVar1 = *pfVar4;
          pfVar4 = tcu::Vector<float,_4>::w
                             ((Vector<float,_4> *)(*(long *)((long)p0.m_data[3] + 8) + 8));
          if (*pfVar4 <= fVar1 && fVar1 != *pfVar4) goto LAB_00286172;
        }
        cliputil::vec4ToClipVec4((ClipVec4 *)local_80,(Vec4 *)(*(long *)p0.m_data[3] + 8));
        cliputil::vec4ToClipVec4((ClipVec4 *)&t0,(Vec4 *)(*(long *)((long)p0.m_data[3] + 8) + 8));
        t1 = cliputil::getLineEndpointClipping((ClipVec4 *)local_80,(ClipVec4 *)&t0);
        local_c0 = cliputil::getLineEndpointClipping((ClipVec4 *)&t0,(ClipVec4 *)local_80);
        if ((((t1 != 0.0) || (NAN(t1))) || (local_c0 != 0.0)) || (NAN(local_c0))) {
          tcu::mix<4>(&local_108,(Vector<double,_4> *)local_80,(Vector<double,_4> *)&t0,t1);
          cliputil::clipVec4ToVec4((cliputil *)&local_e8,&local_108);
          lVar2 = *(long *)p0.m_data[3];
          *(undefined8 *)(lVar2 + 8) = local_e8;
          *(undefined8 *)(lVar2 + 0x10) = uStack_e0;
          tcu::mix<4>((Vector<double,_4> *)&outputNdx,(Vector<double,_4> *)&t0,
                      (Vector<double,_4> *)local_80,local_c0);
          cliputil::clipVec4ToVec4((cliputil *)&local_118,(ClipVec4 *)&outputNdx);
          lVar2 = *(long *)((long)p0.m_data[3] + 8);
          *(undefined8 *)(lVar2 + 8) = local_118;
          *(undefined8 *)(lVar2 + 0x10) = local_110;
          a0.m_data[2] = 0.0;
          a0.m_data[3] = 0.0;
          for (; sVar5 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                         ::size((vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 *)visibleLines.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage),
              (ulong)a0.m_data._8_8_ < sVar5; a0.m_data._8_8_ = a0.m_data._8_8_ + 1) {
            pvVar6 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                     operator[]((vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 *)visibleLines.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,a0.m_data._8_8_
                               );
            if (pvVar6->type == GENERICVECTYPE_FLOAT) {
              GenericVec4::get<float>((GenericVec4 *)(a1.m_data + 2));
              GenericVec4::get<float>((GenericVec4 *)local_160);
              tcu::mix<4>((tcu *)&local_170,(Vector<float,_4> *)(a1.m_data + 2),
                          (Vector<float,_4> *)local_160,(float)t1);
              GenericVec4::operator=
                        ((GenericVec4 *)(*(long *)p0.m_data[3] + 0x20 + a0.m_data._8_8_ * 0x10),
                         &local_170);
              tcu::mix<4>((tcu *)&local_180,(Vector<float,_4> *)local_160,
                          (Vector<float,_4> *)(a1.m_data + 2),(float)local_c0);
              GenericVec4::operator=
                        ((GenericVec4 *)
                         (*(long *)((long)p0.m_data[3] + 8) + 0x20 + a0.m_data._8_8_ * 0x10),
                         &local_180);
            }
          }
          pa::Line::Line(&local_198,*(VertexPacket **)p0.m_data[3],
                         *(VertexPacket **)((long)p0.m_data[3] + 8),-1);
          std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::push_back
                    ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)local_48,&local_198);
        }
        else {
          pa::Line::Line(&local_d8,*(VertexPacket **)p0.m_data[3],
                         *(VertexPacket **)((long)p0.m_data[3] + 8),-1);
          std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::push_back
                    ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)local_48,&local_d8);
        }
      }
      else {
        pfVar4 = tcu::Vector<float,_4>::z
                           ((Vector<float,_4> *)(*(long *)((long)p0.m_data[3] + 8) + 8));
        fVar1 = *pfVar4;
        pfVar4 = tcu::Vector<float,_4>::w
                           ((Vector<float,_4> *)(*(long *)((long)p0.m_data[3] + 8) + 8));
        if (-*pfVar4 <= fVar1) goto LAB_00285dde;
      }
LAB_00286172:
    }
    std::swap<rr::pa::Line,std::allocator<rr::pa::Line>>
              ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)local_48,list);
  }
  std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::~vector
            ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)local_48);
  return;
}

Assistant:

void clipPrimitives (std::vector<pa::Line>&			list,
					 const Program&					program,
					 bool							clipWithZPlanes,
					 VertexPacketAllocator&			vpalloc)
{
	DE_UNREF(vpalloc);

	using namespace cliputil;

	// Lines are clipped only by the far and the near planes here. Line clipping by other planes done in the rasterization phase

	const std::vector<rr::VertexVaryingInfo>&	fragInputs	= (program.geometryShader) ? (program.geometryShader->getOutputs()) : (program.vertexShader->getOutputs());
	std::vector<pa::Line>						visibleLines;

	// Z-clipping disabled, don't do anything
	if (!clipWithZPlanes)
		return;

	for (size_t ndx = 0; ndx < list.size(); ++ndx)
	{
		pa::Line& l = list[ndx];

		// Totally discarded?
		if ((l.v0->position.z() < -l.v0->position.w() && l.v1->position.z() < -l.v1->position.w()) ||
			(l.v0->position.z() >  l.v0->position.w() && l.v1->position.z() >  l.v1->position.w()))
			continue; // discard

		// Something is visible

		const ClipVec4	p0	= vec4ToClipVec4(l.v0->position);
		const ClipVec4	p1	= vec4ToClipVec4(l.v1->position);
		const ClipFloat	t0	= getLineEndpointClipping(p0, p1);
		const ClipFloat	t1	= getLineEndpointClipping(p1, p0);

		// Not clipped at all?
		if (t0 == (ClipFloat)0.0 && t1 == (ClipFloat)0.0)
		{
			visibleLines.push_back(pa::Line(l.v0, l.v1, -1));
		}
		else
		{
			// Clip position
			l.v0->position = clipVec4ToVec4(tcu::mix(p0, p1, t0));
			l.v1->position = clipVec4ToVec4(tcu::mix(p1, p0, t1));

			// Clip attributes
			for (size_t outputNdx = 0; outputNdx < fragInputs.size(); ++outputNdx)
			{
				// only floats are clipped, other types are flatshaded
				if (fragInputs[outputNdx].type == GENERICVECTYPE_FLOAT)
				{
					const tcu::Vec4 a0 = l.v0->outputs[outputNdx].get<float>();
					const tcu::Vec4 a1 = l.v1->outputs[outputNdx].get<float>();

					l.v0->outputs[outputNdx] = tcu::mix(a0, a1, (float)t0);
					l.v1->outputs[outputNdx] = tcu::mix(a1, a0, (float)t1);
				}
			}

			visibleLines.push_back(pa::Line(l.v0, l.v1, -1));
		}
	}

	// return visible in list
	std::swap(visibleLines, list);
}